

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_casts.cpp
# Opt level: O2

bool duckdb::AggregateStateToBlobCast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  TypeMismatchException *this;
  allocator local_41;
  string local_40;
  
  if ((result->type).id_ == BLOB) {
    Vector::Reinterpret(result,source);
    return true;
  }
  this = (TypeMismatchException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Cannot cast AGGREGATE_STATE to anything but BLOB",&local_41);
  TypeMismatchException::TypeMismatchException(this,&source->type,&result->type,&local_40);
  __cxa_throw(this,&TypeMismatchException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static bool AggregateStateToBlobCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	if (result.GetType().id() != LogicalTypeId::BLOB) {
		throw TypeMismatchException(source.GetType(), result.GetType(),
		                            "Cannot cast AGGREGATE_STATE to anything but BLOB");
	}
	result.Reinterpret(source);
	return true;
}